

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[41],kj::String&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [41],String *params_2,char (*params_3) [3])

{
  ArrayPtr<const_char> *value;
  char (*value_00) [41];
  String *value_01;
  char (*value_02) [3];
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  String *local_30;
  char (*params_local_3) [3];
  String *params_local_2;
  char (*params_local_1) [41];
  ArrayPtr<const_char> *params_local;
  
  local_30 = params_2;
  params_local_3 = (char (*) [3])params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [41])this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  value = fwd<kj::ArrayPtr<char_const>&>((ArrayPtr<const_char> *)this);
  local_40 = toCharSequence<kj::ArrayPtr<char_const>&>(value);
  value_00 = ::const((char (*) [41])params_local_2);
  local_50 = toCharSequence<char_const(&)[41]>(value_00);
  value_01 = fwd<kj::String&>((String *)params_local_3);
  local_60 = toCharSequence<kj::String&>(value_01);
  value_02 = ::const((char (*) [3])local_30);
  local_70 = toCharSequence<char_const(&)[3]>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}